

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O1

PVG_FT_Error ft_stroker_outside(PVG_FT_Stroker stroker,PVG_FT_Int side,PVG_FT_Fixed line_length)

{
  long lVar1;
  PVG_FT_Stroker_LineJoin PVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  PVG_FT_Error PVar6;
  ulong uVar7;
  PVG_FT_Long PVar8;
  PVG_FT_Angle angle;
  PVG_FT_Fixed length;
  ulong angle_00;
  PVG_FT_StrokeBorder border;
  PVG_FT_Vector *vec;
  PVG_FT_Vector sigma;
  PVG_FT_Vector delta;
  PVG_FT_Vector delta_1;
  PVG_FT_Vector local_68;
  PVG_FT_Vector local_50;
  PVG_FT_Vector local_40;
  
  PVar2 = stroker->line_join;
  if (PVar2 == PVG_FT_STROKER_LINEJOIN_ROUND) {
    PVar6 = ft_stroker_arcto(stroker,side);
    return PVar6;
  }
  uVar4 = (ulong)(uint)side;
  length = stroker->radius;
  local_68.x = 0;
  local_68.y = 0;
  lVar1 = uVar4 * -0xb40000 + 0x5a0000;
  if (PVar2 == PVG_FT_STROKER_LINEJOIN_BEVEL) {
    angle = 0;
    bVar5 = false;
  }
  else {
    uVar7 = PVG_FT_Angle_Diff(stroker->angle_in,stroker->angle_out);
    angle_00 = uVar4 * 0xb40000 - 0x5a0000;
    if ((uVar7 & 0xfffffffffffffffe) != 0xb40000) {
      angle_00 = (long)uVar7 / 2;
    }
    angle = stroker->angle_in + lVar1 + angle_00;
    PVG_FT_Vector_From_Polar(&local_68,stroker->miter_limit,angle_00);
    bVar5 = true;
    if (local_68.x < 0x10000) {
      uVar7 = -angle_00;
      if (0 < (long)angle_00) {
        uVar7 = angle_00;
      }
      bVar5 = uVar7 < 0x3a && PVar2 == PVG_FT_STROKER_LINEJOIN_MITER;
    }
  }
  border = stroker->borders + uVar4;
  if (bVar5) {
    PVar8 = PVG_FT_MulDiv(stroker->radius,stroker->miter_limit,local_68.x);
    PVG_FT_Vector_From_Polar(&local_50,PVar8,angle);
    local_50.x = local_50.x + (stroker->center).x;
    local_50.y = local_50.y + (stroker->center).y;
    PVar6 = ft_stroke_border_lineto(border,&local_50,'\0');
    if (line_length != 0) {
      return PVar6;
    }
    length = stroker->radius;
    lVar3 = stroker->angle_out;
    vec = &local_50;
  }
  else {
    if (PVar2 != PVG_FT_STROKER_LINEJOIN_MITER) {
      vec = &local_50;
      PVG_FT_Vector_From_Polar(vec,length,lVar1 + stroker->angle_out);
      local_50.x = local_50.x + (stroker->center).x;
      local_50.y = local_50.y + (stroker->center).y;
      stroker->borders[uVar4].movable = '\0';
      goto LAB_00124d91;
    }
    PVar8 = PVG_FT_MulFix(length,stroker->miter_limit);
    PVG_FT_Vector_From_Polar(&local_50,PVar8,angle);
    PVar8 = PVG_FT_DivFix(0x10000 - local_68.x,local_68.y);
    local_40.x = PVG_FT_MulFix(local_50.y,PVar8);
    PVar8 = PVG_FT_MulFix(-local_50.x,PVar8);
    local_50.x = local_50.x + (stroker->center).x;
    local_50.y = local_50.y + (stroker->center).y;
    local_40.x = local_40.x + local_50.x;
    local_40.y = local_50.y + PVar8;
    ft_stroke_border_lineto(border,&local_40,'\0');
    local_40.x = local_50.x * 2 - local_40.x;
    local_40.y = local_50.y * 2 - local_40.y;
    PVar6 = ft_stroke_border_lineto(border,&local_40,'\0');
    if (line_length != 0) {
      return PVar6;
    }
    lVar3 = stroker->angle_out;
    vec = &local_40;
  }
  PVG_FT_Vector_From_Polar(vec,length,lVar1 + lVar3);
  vec->x = vec->x + (stroker->center).x;
  vec->y = vec->y + (stroker->center).y;
LAB_00124d91:
  PVar6 = ft_stroke_border_lineto(border,vec,'\0');
  return PVar6;
}

Assistant:

static PVG_FT_Error
ft_stroker_outside( PVG_FT_Stroker  stroker,
                    PVG_FT_Int      side,
                    PVG_FT_Fixed    line_length )
{
    PVG_FT_StrokeBorder  border = stroker->borders + side;
    PVG_FT_Error         error;
    PVG_FT_Angle         rotate;


    if ( stroker->line_join == PVG_FT_STROKER_LINEJOIN_ROUND )
      error = ft_stroker_arcto( stroker, side );
    else
    {
      /* this is a mitered (pointed) or beveled (truncated) corner */
      PVG_FT_Fixed   radius = stroker->radius;
      PVG_FT_Vector  sigma = {0, 0};
      PVG_FT_Angle   theta = 0, phi = 0;
      PVG_FT_Bool    bevel, fixed_bevel;


      rotate = PVG_FT_SIDE_TO_ROTATE( side );

      bevel =
        PVG_FT_BOOL( stroker->line_join == PVG_FT_STROKER_LINEJOIN_BEVEL );

      fixed_bevel =
        PVG_FT_BOOL( stroker->line_join != PVG_FT_STROKER_LINEJOIN_MITER_VARIABLE );

      /* check miter limit first */
      if ( !bevel )
      {
        theta = PVG_FT_Angle_Diff( stroker->angle_in, stroker->angle_out ) / 2;

        if ( theta == PVG_FT_ANGLE_PI2 )
          theta = -rotate;

        phi    = stroker->angle_in + theta + rotate;

        PVG_FT_Vector_From_Polar( &sigma, stroker->miter_limit, theta );

        /* is miter limit exceeded? */
        if ( sigma.x < 0x10000L )
        {
          /* don't create variable bevels for very small deviations; */
          /* FT_Sin(x) = 0 for x <= 57                               */
          if ( fixed_bevel || ft_pos_abs( theta ) > 57 )
            bevel = TRUE;
        }
      }

      if ( bevel )  /* this is a bevel (broken angle) */
      {
        if ( fixed_bevel )
        {
          /* the outer corners are simply joined together */
          PVG_FT_Vector  delta;


          /* add bevel */
          PVG_FT_Vector_From_Polar( &delta,
                                radius,
                                stroker->angle_out + rotate );
          delta.x += stroker->center.x;
          delta.y += stroker->center.y;

          border->movable = FALSE;
          error = ft_stroke_border_lineto( border, &delta, FALSE );
        }
        else /* variable bevel or clipped miter */
        {
          /* the miter is truncated */
          PVG_FT_Vector  middle, delta;
          PVG_FT_Fixed   coef;


          /* compute middle point and first angle point */
          PVG_FT_Vector_From_Polar( &middle,
                                   PVG_FT_MulFix( radius, stroker->miter_limit ),
                                   phi );

          coef    = PVG_FT_DivFix(  0x10000L - sigma.x, sigma.y );
          delta.x = PVG_FT_MulFix(  middle.y, coef );
          delta.y = PVG_FT_MulFix( -middle.x, coef );

          middle.x += stroker->center.x;
          middle.y += stroker->center.y;
          delta.x  += middle.x;
          delta.y  += middle.y;

          error = ft_stroke_border_lineto( border, &delta, FALSE );
          if ( error )
            goto Exit;

          /* compute second angle point */
          delta.x = middle.x - delta.x + middle.x;
          delta.y = middle.y - delta.y + middle.y;

          error = ft_stroke_border_lineto( border, &delta, FALSE );
          if ( error )
            goto Exit;

          /* finally, add an end point; only needed if not lineto */
          /* (line_length is zero for curves)                     */
          if ( line_length == 0 )
          {
            PVG_FT_Vector_From_Polar( &delta,
                                  radius,
                                  stroker->angle_out + rotate );

            delta.x += stroker->center.x;
            delta.y += stroker->center.y;

            error = ft_stroke_border_lineto( border, &delta, FALSE );
          }
        }
      }
      else /* this is a miter (intersection) */
      {
        PVG_FT_Fixed   length;
        PVG_FT_Vector  delta;


        length = PVG_FT_MulDiv( stroker->radius, stroker->miter_limit, sigma.x );

        PVG_FT_Vector_From_Polar( &delta, length, phi );
        delta.x += stroker->center.x;
        delta.y += stroker->center.y;

        error = ft_stroke_border_lineto( border, &delta, FALSE );
        if ( error )
          goto Exit;

        /* now add an end point; only needed if not lineto */
        /* (line_length is zero for curves)                */
        if ( line_length == 0 )
        {
          PVG_FT_Vector_From_Polar( &delta,
                                stroker->radius,
                                stroker->angle_out + rotate );
          delta.x += stroker->center.x;
          delta.y += stroker->center.y;

          error = ft_stroke_border_lineto( border, &delta, FALSE );
        }
      }
    }

  Exit:
    return error;
}